

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

bool __thiscall PowerPos<0,_0,_0>::propagate_x(PowerPos<0,_0,_0> *this)

{
  bool bVar1;
  int64_t iVar2;
  int64_t iVar3;
  Reason *this_00;
  IntView<0> *this_01;
  double dVar4;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  Reason m_r_1;
  int64_t m_v_1;
  int64_t x_max_new;
  Reason m_r;
  int64_t m_v;
  int64_t x_min_new;
  double pow_res;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  IntView<0> *in_stack_ffffffffffffff50;
  IntView<0> *this_02;
  IntView<0> *in_stack_ffffffffffffff58;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_ffffffffffffff60;
  Reason *in_stack_ffffffffffffff68;
  long in_stack_ffffffffffffff70;
  Reason local_58;
  Reason *local_50;
  Reason *local_48;
  anon_union_8_2_743a5d44_for_Reason_0 local_40;
  int local_38;
  int local_34;
  anon_union_8_2_743a5d44_for_Reason_0 local_30;
  long local_28;
  long local_20;
  double local_18;
  
  iVar2 = IntView<0>::getMin(in_stack_ffffffffffffff50);
  iVar3 = IntView<0>::getMax(in_stack_ffffffffffffff50);
  local_18 = pow((double)iVar2,1.0 / (double)iVar3);
  dVar4 = ceil(local_18);
  local_20 = (long)dVar4;
  iVar2 = IntView<0>::getMin(in_stack_ffffffffffffff50);
  if (iVar2 < (long)dVar4) {
    iVar2 = IntView<0>::getMin(in_stack_ffffffffffffff50);
    in_stack_ffffffffffffff70 = local_20 + -1;
    iVar3 = IntView<0>::getMax(in_stack_ffffffffffffff50);
    iVar3 = my_pow(in_stack_ffffffffffffff70,iVar3);
    if (iVar2 <= iVar3) {
      local_20 = local_20 + -1;
    }
    local_28 = local_20;
    bVar1 = IntView<0>::setMinNotR
                      (in_stack_ffffffffffffff50,
                       CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    if (bVar1) {
      Reason::Reason((Reason *)&local_30,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        local_34 = (int)IntView<0>::getMinLit
                                  ((IntView<0> *)
                                   CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
        local_38 = (int)IntView<0>::getMaxLit
                                  ((IntView<0> *)
                                   CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
        Reason::Reason(in_stack_ffffffffffffff68,
                       (Lit)(int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                       (Lit)(int)in_stack_ffffffffffffff70);
      }
      local_40 = local_30;
      bVar1 = IntView<0>::setMin(in_stack_ffffffffffffff58,(int64_t)in_stack_ffffffffffffff50,
                                 (Reason)in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff4f);
      if (!bVar1) {
        return false;
      }
    }
  }
  iVar2 = IntView<0>::getMax(in_stack_ffffffffffffff50);
  r = (anon_union_8_2_743a5d44_for_Reason_0)(double)iVar2;
  iVar2 = IntView<0>::getMin(in_stack_ffffffffffffff50);
  local_18 = pow((double)r,1.0 / (double)iVar2);
  dVar4 = floor(local_18);
  this_00 = (Reason *)(long)dVar4;
  local_48 = this_00;
  iVar2 = IntView<0>::getMax(in_stack_ffffffffffffff50);
  if ((long)this_00 < iVar2) {
    this_01 = (IntView<0> *)IntView<0>::getMax(in_stack_ffffffffffffff50);
    this_02 = (IntView<0> *)((long)&(local_48->field_0)._pt + 1);
    iVar2 = IntView<0>::getMin(this_02);
    iVar2 = my_pow((int64_t)this_02,iVar2);
    if (iVar2 <= (long)this_01) {
      local_48 = (Reason *)((long)&local_48->field_0 + 1);
    }
    local_50 = local_48;
    bVar1 = IntView<0>::setMaxNotR
                      (this_02,CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    if (bVar1) {
      Reason::Reason(&local_58,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        IntView<0>::getMaxLit
                  ((IntView<0> *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
        IntView<0>::getMinLit
                  ((IntView<0> *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
        Reason::Reason(this_00,(Lit)(int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                       (Lit)(int)in_stack_ffffffffffffff70);
      }
      bVar1 = IntView<0>::setMax(this_01,(int64_t)this_02,(Reason)r,(bool)in_stack_ffffffffffffff4f)
      ;
      if (!bVar1) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool propagate_x() {
		// Propagation on the lower bound
		double pow_res;
		pow_res = pow(z.getMin(), 1 / (double)y.getMax());
		int64_t x_min_new = static_cast<int64_t>(ceil(pow_res));
		if (x_min_new > x.getMin()) {
			// Check for numerical errors and correct them
			if (z.getMin() <= my_pow(x_min_new - 1, y.getMax())) {
				x_min_new--;
			}
			setDom(x, setMin, x_min_new, z.getMinLit(), y.getMaxLit());
		}
		// Propagation on the upper bound
		pow_res = pow(z.getMax(), 1 / (double)y.getMin());
		int64_t x_max_new = static_cast<int64_t>(floor(pow_res));
		if (x_max_new < x.getMax()) {
			// Check for numerical errors and correct them
			if (z.getMax() >= my_pow(x_max_new + 1, y.getMin())) {
				x_max_new++;
			}
			setDom(x, setMax, x_max_new, z.getMaxLit(), y.getMinLit());
		}
		return true;
	}